

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void __thiscall
embree::avx2::
BVHNIntersector1<8,_1,_false,_embree::avx2::ArrayIntersector1<embree::avx2::InstanceIntersector1>_>
::intersect(BVHNIntersector1<8,_1,_false,_embree::avx2::ArrayIntersector1<embree::avx2::InstanceIntersector1>_>
            *this,Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  ulong uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  RayQueryContext *pRVar4;
  undefined8 uVar5;
  undefined1 (*pauVar6) [16];
  undefined4 uVar7;
  int iVar8;
  undefined1 (*pauVar9) [16];
  ulong uVar10;
  long lVar11;
  undefined1 (*pauVar12) [16];
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  InstancePrimitive *prim;
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar25;
  undefined1 auVar26 [16];
  uint uVar27;
  uint uVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  Precalculations pre;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 (*local_24e8) [16];
  Precalculations local_24d9;
  ulong local_24d8;
  ulong local_24d0;
  ulong local_24c8;
  ulong local_24c0;
  ulong local_24b8;
  RayQueryContext *local_24b0;
  ulong local_24a8;
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  if (*(long *)(*(long *)this + 0x70) != 8) {
    local_23a0 = *(long *)(*(long *)this + 0x70);
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      local_24e8 = (undefined1 (*) [16])local_2390;
      auVar22 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416(*(uint *)((long)&This->leafIntersector + 4)));
      auVar24 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416(*(uint *)&(This->intersector1).intersect));
      auVar28._8_4_ = 0x7fffffff;
      auVar28._0_8_ = 0x7fffffff7fffffff;
      auVar28._12_4_ = 0x7fffffff;
      auVar28 = vandps_avx((undefined1  [16])This->collider,auVar28);
      auVar32._8_4_ = 0x219392ef;
      auVar32._0_8_ = 0x219392ef219392ef;
      auVar32._12_4_ = 0x219392ef;
      auVar28 = vcmpps_avx(auVar28,auVar32,1);
      auVar28 = vblendvps_avx((undefined1  [16])This->collider,auVar32,auVar28);
      auVar32 = vrcpps_avx(auVar28);
      auVar33._8_4_ = 0x3f800000;
      auVar33._0_8_ = &DAT_3f8000003f800000;
      auVar33._12_4_ = 0x3f800000;
      auVar28 = vfnmadd231ps_fma(auVar33,auVar32,auVar28);
      auVar26 = vfmadd132ps_fma(auVar28,auVar32,auVar32);
      fVar31 = auVar26._0_4_;
      local_23c0._4_4_ = fVar31;
      local_23c0._0_4_ = fVar31;
      local_23c0._8_4_ = fVar31;
      local_23c0._12_4_ = fVar31;
      local_23c0._16_4_ = fVar31;
      local_23c0._20_4_ = fVar31;
      local_23c0._24_4_ = fVar31;
      local_23c0._28_4_ = fVar31;
      auVar39 = ZEXT3264(local_23c0);
      auVar28 = vmovshdup_avx(auVar26);
      uVar25 = auVar28._0_8_;
      local_23e0._8_8_ = uVar25;
      local_23e0._0_8_ = uVar25;
      local_23e0._16_8_ = uVar25;
      local_23e0._24_8_ = uVar25;
      auVar40 = ZEXT3264(local_23e0);
      auVar33 = vshufpd_avx(auVar26,auVar26,1);
      auVar32 = vshufps_avx(auVar26,auVar26,0xaa);
      uVar25 = auVar32._0_8_;
      local_2400._8_8_ = uVar25;
      local_2400._0_8_ = uVar25;
      local_2400._16_8_ = uVar25;
      local_2400._24_8_ = uVar25;
      auVar41 = ZEXT3264(local_2400);
      auVar34._0_4_ = fVar31 * *(float *)&This->ptr;
      auVar34._4_4_ = auVar26._4_4_ * *(float *)((long)&This->ptr + 4);
      auVar34._8_4_ = auVar26._8_4_ * *(float *)&This->leafIntersector;
      auVar34._12_4_ = auVar26._12_4_ * *(float *)((long)&This->leafIntersector + 4);
      auVar32 = vmovshdup_avx(auVar34);
      auVar26 = vshufps_avx(auVar34,auVar34,0xaa);
      local_24b8 = (ulong)(fVar31 < 0.0) << 5;
      local_24c0 = (ulong)(auVar28._0_4_ < 0.0) << 5 | 0x40;
      local_24c8 = (ulong)(auVar33._0_4_ < 0.0) << 5 | 0x80;
      local_24d0 = local_24b8 ^ 0x20;
      local_24d8 = local_24c0 ^ 0x20;
      local_24a8 = local_24c8 ^ 0x20;
      uVar7 = auVar24._0_4_;
      auVar21 = ZEXT3264(CONCAT428(uVar7,CONCAT424(uVar7,CONCAT420(uVar7,CONCAT416(uVar7,CONCAT412(
                                                  uVar7,CONCAT48(uVar7,CONCAT44(uVar7,uVar7))))))));
      uVar13 = CONCAT44(auVar34._0_4_,auVar34._0_4_);
      local_2420._0_8_ = uVar13 ^ 0x8000000080000000;
      local_2420._8_4_ = -auVar34._0_4_;
      local_2420._12_4_ = -auVar34._0_4_;
      local_2420._16_4_ = -auVar34._0_4_;
      local_2420._20_4_ = -auVar34._0_4_;
      local_2420._24_4_ = -auVar34._0_4_;
      local_2420._28_4_ = -auVar34._0_4_;
      auVar36 = ZEXT3264(local_2420);
      uVar27 = auVar32._0_4_;
      uVar30 = auVar32._4_4_;
      local_2440._0_8_ = auVar32._0_8_ ^ 0x8000000080000000;
      local_2440._8_4_ = uVar27 ^ 0x80000000;
      local_2440._12_4_ = uVar30 ^ 0x80000000;
      local_2440._16_4_ = uVar27 ^ 0x80000000;
      local_2440._20_4_ = uVar30 ^ 0x80000000;
      local_2440._24_4_ = uVar27 ^ 0x80000000;
      local_2440._28_4_ = uVar30 ^ 0x80000000;
      auVar38 = ZEXT3264(local_2440);
      uVar27 = auVar26._0_4_;
      uVar30 = auVar26._4_4_;
      local_2460._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
      local_2460._8_4_ = uVar27 ^ 0x80000000;
      local_2460._12_4_ = uVar30 ^ 0x80000000;
      local_2460._16_4_ = uVar27 ^ 0x80000000;
      local_2460._20_4_ = uVar30 ^ 0x80000000;
      local_2460._24_4_ = uVar27 ^ 0x80000000;
      local_2460._28_4_ = uVar30 ^ 0x80000000;
      auVar43 = ZEXT3264(local_2460);
      uVar7 = auVar22._0_4_;
      local_2480._4_4_ = uVar7;
      local_2480._0_4_ = uVar7;
      local_2480._8_4_ = uVar7;
      local_2480._12_4_ = uVar7;
      local_2480._16_4_ = uVar7;
      local_2480._20_4_ = uVar7;
      local_2480._24_4_ = uVar7;
      local_2480._28_4_ = uVar7;
      auVar44 = ZEXT3264(local_2480);
      uVar13 = local_24d0;
      uVar14 = local_24d8;
      uVar15 = local_24b8;
      uVar16 = local_24c0;
      uVar18 = local_24c8;
      do {
        do {
          if (local_24e8 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          pauVar6 = local_24e8 + -1;
          local_24e8 = local_24e8 + -1;
        } while (*(float *)&(This->intersector1).intersect < *(float *)(*pauVar6 + 8));
        uVar20 = *(ulong *)*local_24e8;
        do {
          auVar42 = auVar43._0_32_;
          auVar37 = auVar38._0_32_;
          auVar35 = auVar36._0_32_;
          if ((uVar20 & 8) == 0) {
            auVar28 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar20 + 0x40 + uVar15),auVar35,
                                      auVar39._0_32_);
            auVar22 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar20 + 0x40 + uVar16),auVar37,
                                      auVar40._0_32_);
            auVar2 = vpmaxsd_avx2(ZEXT1632(auVar28),ZEXT1632(auVar22));
            auVar28 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar20 + 0x40 + uVar18),auVar42,
                                      auVar41._0_32_);
            auVar3 = vpmaxsd_avx2(ZEXT1632(auVar28),auVar44._0_32_);
            local_24a0 = vpmaxsd_avx2(auVar2,auVar3);
            auVar28 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar20 + 0x40 + uVar13),auVar35,
                                      auVar39._0_32_);
            auVar22 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar20 + 0x40 + uVar14),auVar37,
                                      auVar40._0_32_);
            auVar2 = vpminsd_avx2(ZEXT1632(auVar28),ZEXT1632(auVar22));
            auVar28 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar20 + 0x40 + local_24a8),auVar42,
                                      auVar41._0_32_);
            auVar3 = vpminsd_avx2(ZEXT1632(auVar28),auVar21._0_32_);
            auVar2 = vpminsd_avx2(auVar2,auVar3);
            auVar2 = vpcmpgtd_avx2(local_24a0,auVar2);
            uVar7 = vmovmskps_avx(auVar2);
            context = (RayQueryContext *)(ulong)(byte)~(byte)uVar7;
          }
          if ((uVar20 & 8) == 0) {
            if (context == (RayQueryContext *)0x0) {
              iVar8 = 4;
            }
            else {
              uVar19 = uVar20 & 0xfffffffffffffff0;
              lVar17 = 0;
              for (pRVar4 = context; ((ulong)pRVar4 & 1) == 0;
                  pRVar4 = (RayQueryContext *)((ulong)pRVar4 >> 1 | 0x8000000000000000)) {
                lVar17 = lVar17 + 1;
              }
              iVar8 = 0;
              uVar10 = (ulong)((long)&context[-1].args + 7U) & (ulong)context;
              uVar20 = *(ulong *)(uVar19 + lVar17 * 8);
              if (uVar10 != 0) {
                uVar27 = *(uint *)(local_24a0 + lVar17 * 4);
                lVar17 = 0;
                for (uVar13 = uVar10; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000)
                {
                  lVar17 = lVar17 + 1;
                }
                uVar10 = uVar10 - 1 & uVar10;
                uVar1 = *(ulong *)(uVar19 + lVar17 * 8);
                uVar30 = *(uint *)(local_24a0 + lVar17 * 4);
                uVar13 = local_24d0;
                uVar14 = local_24d8;
                if (uVar10 == 0) {
                  if (uVar27 < uVar30) {
                    *(ulong *)*local_24e8 = uVar1;
                    *(uint *)(*local_24e8 + 8) = uVar30;
                    local_24e8 = local_24e8 + 1;
                  }
                  else {
                    *(ulong *)*local_24e8 = uVar20;
                    *(uint *)(*local_24e8 + 8) = uVar27;
                    uVar20 = uVar1;
                    local_24e8 = local_24e8 + 1;
                  }
                }
                else {
                  auVar22._8_8_ = 0;
                  auVar22._0_8_ = uVar20;
                  auVar28 = vpunpcklqdq_avx(auVar22,ZEXT416(uVar27));
                  auVar24._8_8_ = 0;
                  auVar24._0_8_ = uVar1;
                  auVar22 = vpunpcklqdq_avx(auVar24,ZEXT416(uVar30));
                  lVar17 = 0;
                  for (uVar20 = uVar10; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000
                      ) {
                    lVar17 = lVar17 + 1;
                  }
                  uVar10 = uVar10 - 1 & uVar10;
                  auVar26._8_8_ = 0;
                  auVar26._0_8_ = *(ulong *)(uVar19 + lVar17 * 8);
                  auVar24 = vpunpcklqdq_avx(auVar26,ZEXT416(*(uint *)(local_24a0 + lVar17 * 4)));
                  if (uVar10 == 0) {
                    auVar32 = vpcmpgtd_avx(auVar22,auVar28);
                    auVar33 = vpshufd_avx(auVar32,0xaa);
                    auVar32 = vblendvps_avx(auVar22,auVar28,auVar33);
                    auVar28 = vblendvps_avx(auVar28,auVar22,auVar33);
                    auVar22 = vpcmpgtd_avx(auVar24,auVar32);
                    auVar33 = vpshufd_avx(auVar22,0xaa);
                    auVar22 = vblendvps_avx(auVar24,auVar32,auVar33);
                    auVar24 = vblendvps_avx(auVar32,auVar24,auVar33);
                    auVar32 = vpcmpgtd_avx(auVar24,auVar28);
                    auVar33 = vpshufd_avx(auVar32,0xaa);
                    auVar32 = vblendvps_avx(auVar24,auVar28,auVar33);
                    auVar28 = vblendvps_avx(auVar28,auVar24,auVar33);
                    *local_24e8 = auVar28;
                    local_24e8[1] = auVar32;
                    uVar20 = auVar22._0_8_;
                    local_24e8 = local_24e8 + 2;
                  }
                  else {
                    lVar17 = 0;
                    for (uVar18 = uVar10; (uVar18 & 1) == 0;
                        uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                      lVar17 = lVar17 + 1;
                    }
                    uVar10 = uVar10 - 1 & uVar10;
                    auVar29._8_8_ = 0;
                    auVar29._0_8_ = *(ulong *)(uVar19 + lVar17 * 8);
                    auVar32 = vpunpcklqdq_avx(auVar29,ZEXT416(*(uint *)(local_24a0 + lVar17 * 4)));
                    if (uVar10 == 0) {
                      auVar33 = vpcmpgtd_avx(auVar22,auVar28);
                      auVar26 = vpshufd_avx(auVar33,0xaa);
                      auVar33 = vblendvps_avx(auVar22,auVar28,auVar26);
                      auVar28 = vblendvps_avx(auVar28,auVar22,auVar26);
                      auVar22 = vpcmpgtd_avx(auVar32,auVar24);
                      auVar26 = vpshufd_avx(auVar22,0xaa);
                      auVar22 = vblendvps_avx(auVar32,auVar24,auVar26);
                      auVar24 = vblendvps_avx(auVar24,auVar32,auVar26);
                      auVar32 = vpcmpgtd_avx(auVar24,auVar28);
                      auVar26 = vpshufd_avx(auVar32,0xaa);
                      auVar32 = vblendvps_avx(auVar24,auVar28,auVar26);
                      auVar28 = vblendvps_avx(auVar28,auVar24,auVar26);
                      auVar24 = vpcmpgtd_avx(auVar22,auVar33);
                      auVar26 = vpshufd_avx(auVar24,0xaa);
                      auVar24 = vblendvps_avx(auVar22,auVar33,auVar26);
                      auVar22 = vblendvps_avx(auVar33,auVar22,auVar26);
                      auVar33 = vpcmpgtd_avx(auVar32,auVar22);
                      auVar26 = vpshufd_avx(auVar33,0xaa);
                      auVar33 = vblendvps_avx(auVar32,auVar22,auVar26);
                      auVar22 = vblendvps_avx(auVar22,auVar32,auVar26);
                      *local_24e8 = auVar28;
                      local_24e8[1] = auVar22;
                      local_24e8[2] = auVar33;
                      uVar20 = auVar24._0_8_;
                      local_24e8 = local_24e8 + 3;
                    }
                    else {
                      *local_24e8 = auVar28;
                      local_24e8[1] = auVar22;
                      local_24e8[2] = auVar24;
                      local_24e8[3] = auVar32;
                      lVar17 = 0x30;
                      do {
                        lVar11 = lVar17;
                        lVar17 = 0;
                        for (uVar18 = uVar10; (uVar18 & 1) == 0;
                            uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                          lVar17 = lVar17 + 1;
                        }
                        auVar23._8_8_ = 0;
                        auVar23._0_8_ = *(ulong *)(uVar19 + lVar17 * 8);
                        auVar28 = vpunpcklqdq_avx(auVar23,ZEXT416(*(uint *)(local_24a0 + lVar17 * 4)
                                                                 ));
                        *(undefined1 (*) [16])(local_24e8[1] + lVar11) = auVar28;
                        uVar10 = uVar10 - 1 & uVar10;
                        lVar17 = lVar11 + 0x10;
                      } while (uVar10 != 0);
                      pauVar6 = (undefined1 (*) [16])(local_24e8[1] + lVar11);
                      if (lVar11 + 0x10 != 0) {
                        lVar17 = 0x10;
                        pauVar9 = local_24e8;
                        do {
                          uVar25 = *(undefined8 *)pauVar9[1];
                          uVar5 = *(undefined8 *)(pauVar9[1] + 8);
                          uVar27 = *(uint *)(pauVar9[1] + 8);
                          pauVar9 = pauVar9 + 1;
                          lVar11 = lVar17;
                          do {
                            if (uVar27 <= *(uint *)(local_24e8[-1] + lVar11 + 8)) {
                              pauVar12 = (undefined1 (*) [16])(*local_24e8 + lVar11);
                              break;
                            }
                            *(undefined1 (*) [16])(*local_24e8 + lVar11) =
                                 *(undefined1 (*) [16])(local_24e8[-1] + lVar11);
                            lVar11 = lVar11 + -0x10;
                            pauVar12 = local_24e8;
                          } while (lVar11 != 0);
                          *(undefined8 *)*pauVar12 = uVar25;
                          *(undefined8 *)(*pauVar12 + 8) = uVar5;
                          lVar17 = lVar17 + 0x10;
                        } while (pauVar6 != pauVar9);
                      }
                      uVar20 = *(ulong *)*pauVar6;
                      local_24e8 = pauVar6;
                    }
                    auVar36 = ZEXT3264(auVar35);
                    auVar38 = ZEXT3264(auVar37);
                    auVar43 = ZEXT3264(auVar42);
                    auVar44 = ZEXT3264(auVar44._0_32_);
                    uVar18 = local_24c8;
                  }
                }
              }
            }
          }
          else {
            iVar8 = 6;
          }
        } while (iVar8 == 0);
        if (iVar8 == 6) {
          lVar17 = (ulong)((uint)uVar20 & 0xf) - 8;
          local_24b0 = context;
          if (lVar17 != 0) {
            prim = (InstancePrimitive *)(uVar20 & 0xfffffffffffffff0);
            do {
              InstanceIntersector1::intersect
                        (&local_24d9,(RayHit *)This,(RayQueryContext *)ray,prim);
              prim = prim + 1;
              lVar17 = lVar17 + -1;
            } while (lVar17 != 0);
          }
          uVar7 = *(undefined4 *)&(This->intersector1).intersect;
          auVar21 = ZEXT3264(CONCAT428(uVar7,CONCAT424(uVar7,CONCAT420(uVar7,CONCAT416(uVar7,
                                                  CONCAT412(uVar7,CONCAT48(uVar7,CONCAT44(uVar7,
                                                  uVar7))))))));
          auVar39 = ZEXT3264(local_23c0);
          auVar40 = ZEXT3264(local_23e0);
          auVar41 = ZEXT3264(local_2400);
          auVar36 = ZEXT3264(local_2420);
          auVar38 = ZEXT3264(local_2440);
          auVar43 = ZEXT3264(local_2460);
          auVar44 = ZEXT3264(local_2480);
          context = local_24b0;
          uVar13 = local_24d0;
          uVar14 = local_24d8;
          uVar15 = local_24b8;
          uVar16 = local_24c0;
          uVar18 = local_24c8;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }